

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addFunc
          (_Variant_storage<false,wasm::Ok,wasm::Err> *__return_storage_ptr__,ParseDeclsCtx *this,
          _Uninitialized<wasm::Function_*,_true> param_3,char *param_4,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *exports,ImportNames *import,
          undefined8 param_7,undefined8 *param_8,Index param_9)

{
  Name name;
  undefined1 local_c0 [8];
  Result<wasm::Function_*> f;
  undefined1 local_68 [8];
  Result<wasm::Ok> _val;
  
  checkImport((Result<wasm::Ok> *)local_68,this,param_9,import);
  if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
    std::__cxx11::string::string((string *)local_c0,(string *)local_68);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
    _Variant_storage<1ul,wasm::Err>(__return_storage_ptr__,local_c0);
    std::__cxx11::string::~string((string *)local_c0);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
    name.super_IString.str._M_str = param_4;
    name.super_IString.str._M_len = (size_t)param_3._M_storage;
    addFuncDecl((Result<wasm::Function_*> *)local_c0,this,param_9,name,import);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Function_*,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Function_*,_wasm::Err> *)local_68,
               (_Copy_ctor_base<false,_wasm::Function_*,_wasm::Err> *)local_c0);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string
                ((string *)
                 ((long)&f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Function_*,_wasm::Err> + 0x20),
                 (string *)local_68);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                (__return_storage_ptr__,
                 (__index_type *)
                 ((long)&f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Function_*,_wasm::Err> + 0x20));
      std::__cxx11::string::~string
                ((string *)
                 ((long)&f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Function_*,_wasm::Err> + 0x20));
      std::__detail::__variant::_Variant_storage<false,_wasm::Function_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Function_*,_wasm::Err> *)local_68);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Function_*,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Function_*,_wasm::Err> *)local_68);
      anon_unknown_2::addExports
                ((Result<wasm::Ok> *)local_68,&this->in,this->wasm,(Named *)local_c0,exports,
                 Function);
      if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        std::__cxx11::string::string
                  ((string *)
                   ((long)&f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Function_*,_wasm::Err> + 0x20),
                   (string *)local_68);
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
        _Variant_storage<1ul,wasm::Err>
                  (__return_storage_ptr__,
                   (__index_type *)
                   ((long)&f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Function_*,_wasm::Err> + 0x20));
        std::__cxx11::string::~string
                  ((string *)
                   ((long)&f.val.super__Variant_base<wasm::Function_*,_wasm::Err>.
                           super__Move_assign_alias<wasm::Function_*,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Function_*,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Function_*,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Function_*,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_68);
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_4_ = param_9;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._12_4_ =
             (undefined4)
             (((long)(this->funcDefs).
                     super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->funcDefs).
                    super__Vector_base<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30);
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_ = *param_8;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_8_ = param_8[1];
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = param_8[2];
        *param_8 = 0;
        param_8[1] = 0;
        param_8[2] = 0;
        local_68 = (undefined1  [8])param_3._M_storage;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = param_4;
        std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::
        emplace_back<wasm::WATParser::DefPos>(&this->funcDefs,(DefPos *)local_68);
        std::_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
        ::~_Vector_base((_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                         *)((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x10));
        __return_storage_ptr__[0x20] = (_Variant_storage<false,wasm::Ok,wasm::Err>)0x0;
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Function_*,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Function_*,_wasm::Err> *)local_c0);
  }
  return (Result<wasm::Ok> *)__return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addFunc(Name name,
                                const std::vector<Name>& exports,
                                ImportNames* import,
                                TypeUseT type,
                                std::optional<LocalsT>,
                                std::vector<Annotation>&& annotations,
                                Index pos) {
  CHECK_ERR(checkImport(pos, import));
  auto f = addFuncDecl(pos, name, import);
  CHECK_ERR(f);
  CHECK_ERR(addExports(in, wasm, *f, exports, ExternalKind::Function));
  funcDefs.push_back(
    {name, pos, Index(funcDefs.size()), std::move(annotations)});
  return Ok{};
}